

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLeft(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *x,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *z,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *rhs1,
           SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *rhs2,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *rhs3)

{
  int rn2;
  int rn3;
  int *ridx;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rhs;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pnVar1;
  int *idx;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec2;
  int *ridx2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rhs2_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec3;
  Real a;
  int iVar2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar3;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  (*this->solveTime->_vptr_Timer[3])();
  (this->ssvec).setupStatus = false;
  ridx = (this->ssvec).super_IdxSet.idx;
  rhs = (this->ssvec).
        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  epsilon.m_backend.fpclass = cpp_dec_float_finite;
  epsilon.m_backend.prec_elem = 0x10;
  epsilon.m_backend.data._M_elems[0] = 0;
  epsilon.m_backend.data._M_elems[1] = 0;
  epsilon.m_backend.data._M_elems[2] = 0;
  epsilon.m_backend.data._M_elems[3] = 0;
  epsilon.m_backend.data._M_elems[4] = 0;
  epsilon.m_backend.data._M_elems[5] = 0;
  epsilon.m_backend.data._M_elems[6] = 0;
  epsilon.m_backend.data._M_elems[7] = 0;
  epsilon.m_backend.data._M_elems[8] = 0;
  epsilon.m_backend.data._M_elems[9] = 0;
  epsilon.m_backend.data._M_elems[10] = 0;
  epsilon.m_backend.data._M_elems[0xb] = 0;
  epsilon.m_backend.data._M_elems[0xc] = 0;
  epsilon.m_backend.data._M_elems[0xd] = 0;
  epsilon.m_backend.data._M_elems._56_5_ = 0;
  epsilon.m_backend.data._M_elems[0xf]._1_3_ = 0;
  epsilon.m_backend.exp = 0;
  epsilon.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&epsilon,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  pnVar1 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar3 = (y->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pnVar3 != pnVar1; pnVar3 = pnVar3 + 1) {
    (pnVar3->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar3->m_backend).prec_elem = 0x10;
    (pnVar3->m_backend).data._M_elems[0] = 0;
    (pnVar3->m_backend).data._M_elems[1] = 0;
    (pnVar3->m_backend).data._M_elems[2] = 0;
    (pnVar3->m_backend).data._M_elems[3] = 0;
    (pnVar3->m_backend).data._M_elems[4] = 0;
    (pnVar3->m_backend).data._M_elems[5] = 0;
    (pnVar3->m_backend).data._M_elems[6] = 0;
    (pnVar3->m_backend).data._M_elems[7] = 0;
    (pnVar3->m_backend).data._M_elems[8] = 0;
    (pnVar3->m_backend).data._M_elems[9] = 0;
    (pnVar3->m_backend).data._M_elems[10] = 0;
    (pnVar3->m_backend).data._M_elems[0xb] = 0;
    (pnVar3->m_backend).data._M_elems[0xc] = 0;
    (pnVar3->m_backend).data._M_elems[0xd] = 0;
    (pnVar3->m_backend).data._M_elems[0xe] = 0;
    (pnVar3->m_backend).data._M_elems[0xf] = 0;
    *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + 0x3d) = 0;
  }
  pnVar1 = (z->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar3 = (z->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pnVar3 != pnVar1; pnVar3 = pnVar3 + 1) {
    (pnVar3->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar3->m_backend).prec_elem = 0x10;
    (pnVar3->m_backend).data._M_elems[0] = 0;
    (pnVar3->m_backend).data._M_elems[1] = 0;
    (pnVar3->m_backend).data._M_elems[2] = 0;
    (pnVar3->m_backend).data._M_elems[3] = 0;
    (pnVar3->m_backend).data._M_elems[4] = 0;
    (pnVar3->m_backend).data._M_elems[5] = 0;
    (pnVar3->m_backend).data._M_elems[6] = 0;
    (pnVar3->m_backend).data._M_elems[7] = 0;
    (pnVar3->m_backend).data._M_elems[8] = 0;
    (pnVar3->m_backend).data._M_elems[9] = 0;
    (pnVar3->m_backend).data._M_elems[10] = 0;
    (pnVar3->m_backend).data._M_elems[0xb] = 0;
    (pnVar3->m_backend).data._M_elems[0xc] = 0;
    (pnVar3->m_backend).data._M_elems[0xd] = 0;
    (pnVar3->m_backend).data._M_elems[0xe] = 0;
    (pnVar3->m_backend).data._M_elems[0xf] = 0;
    *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + 0x3d) = 0;
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->ssvec,rhs1);
  iVar2 = (this->ssvec).super_IdxSet.num;
  rn2 = (rhs2->super_IdxSet).num;
  rn3 = (rhs3->super_IdxSet).num;
  local_88.m_backend.data._M_elems[0xf]._1_3_ = epsilon.m_backend.data._M_elems[0xf]._1_3_;
  local_88.m_backend.data._M_elems._56_5_ = epsilon.m_backend.data._M_elems._56_5_;
  local_88.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
  local_88.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
  local_88.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
  local_88.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
  local_88.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
  local_88.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
  local_88.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
  local_88.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
  local_88.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
  local_88.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
  local_88.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
  local_88.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
  local_88.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
  local_88.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
  local_88.m_backend.exp = epsilon.m_backend.exp;
  local_88.m_backend.neg = epsilon.m_backend.neg;
  local_88.m_backend.fpclass = epsilon.m_backend.fpclass;
  local_88.m_backend.prec_elem = epsilon.m_backend.prec_elem;
  x->setupStatus = false;
  idx = (x->super_IdxSet).idx;
  vec = (x->
        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  vec2 = (y->val).
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  rhs2->setupStatus = false;
  ridx2 = (rhs2->super_IdxSet).idx;
  rhs2_00 = (rhs2->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  vec3 = (z->val).
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  rhs3->setupStatus = false;
  iVar2 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::vSolveLeft3(&this->
                         super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ,&local_88,vec,idx,rhs,ridx,iVar2,vec2,rhs2_00,ridx2,rn2,vec3,
                        (rhs3->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(rhs3->super_IdxSet).idx,rn3);
  x->setupStatus = false;
  (x->super_IdxSet).num = iVar2;
  if (0 < iVar2) {
    x->setupStatus = true;
  }
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 3;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   VectorBase<R>&        z,
   const SVectorBase<R>& rhs1,
   SSVectorBase<R>&       rhs2,
   SSVectorBase<R>&       rhs3)
{

   solveTime->start();

   int   n, n2, n3;
   R* svec = ssvec.altValues();
   int*  sidx = ssvec.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   z.clear();
   ssvec.assign(rhs1);
   n = ssvec.size(); // see altValues();
   n2 = rhs2.size();
   n3 = rhs3.size();

   n = this->vSolveLeft3(epsilon, x.altValues(), x.altIndexMem(), svec, sidx, n,
                         y.get_ptr(), rhs2.altValues(), rhs2.altIndexMem(), n2,
                         z.get_ptr(), rhs3.altValues(), rhs3.altIndexMem(), n3);

   x.setSize(n);

   if(n > 0)
      x.forceSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}